

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QLoggingRule>::relocate
          (QArrayDataPointer<QLoggingRule> *this,qsizetype offset,QLoggingRule **data)

{
  bool bVar1;
  QLoggingRule *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QLoggingRule *res;
  
  first = (QLoggingRule *)(*(long *)(in_RDI + 8) + in_RSI * 0x28);
  QtPrivate::q_relocate_overlap_n<QLoggingRule,long_long>(first,in_RDI,(QLoggingRule *)0x2d9334);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QLoggingRule>,QLoggingRule_const*>
                        (data,(QArrayDataPointer<QLoggingRule> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x28 + *in_RDX;
  }
  *(QLoggingRule **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }